

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPG.cpp
# Opt level: O1

void __thiscall JPG::quantization(JPG *this)

{
  MCU *pMVar1;
  Block *paiVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Block **ppaiVar6;
  uint uVar7;
  uint uVar8;
  uint componentID;
  uint ID;
  long lVar9;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  
  if (this->mcuHeight != 0) {
    uVar5 = 0;
    do {
      uVar3 = this->mcuWidth;
      if (uVar3 != 0) {
        uVar8 = 0;
        do {
          pMVar1 = this->data;
          ID = 1;
          do {
            uVar4 = getVerticalSamplingFrequency(this,ID);
            if (uVar4 != 0) {
              piVar11 = QUANTIZATION_TABLE_CBCR;
              if (ID == 1) {
                piVar11 = QUANTIZATION_TABLE_Y;
              }
              uVar10 = 0;
              do {
                uVar4 = getHorizontalSamplingFrequency(this,ID);
                if (uVar4 != 0) {
                  uVar12 = 0;
                  do {
                    ppaiVar6 = MCU::operator[](pMVar1 + (uVar3 * uVar5 + uVar8),ID);
                    paiVar2 = *ppaiVar6;
                    uVar4 = getHorizontalSamplingFrequency(this,ID);
                    uVar7 = uVar4 * uVar10 + uVar12;
                    lVar9 = 0;
                    do {
                      paiVar2[uVar7][lVar9] = paiVar2[uVar7][lVar9] / piVar11[lVar9];
                      lVar9 = lVar9 + 1;
                    } while (lVar9 != 0x40);
                    uVar12 = uVar12 + 1;
                    uVar4 = getHorizontalSamplingFrequency(this,ID);
                  } while (uVar12 < uVar4);
                }
                uVar10 = uVar10 + 1;
                uVar4 = getVerticalSamplingFrequency(this,ID);
              } while (uVar10 < uVar4);
            }
            ID = ID + 1;
          } while (ID != 4);
          uVar8 = uVar8 + 1;
          uVar3 = this->mcuWidth;
        } while (uVar8 < uVar3);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->mcuHeight);
  }
  return;
}

Assistant:

void JPG::quantization() {
    for (uint i = 0; i < mcuHeight; i++) {
        for (uint j = 0; j < mcuWidth; j++) {
            MCU& currentMCU = data[i * mcuWidth + j];
            //iterate over 每一个component Y, cb cr
            for (uint componentID = 1; componentID <= 3; componentID++) {
                //遍历block
                for(uint ii = 0; ii < getVerticalSamplingFrequency(componentID); ii++) {
                    for(uint jj = 0; jj < getHorizontalSamplingFrequency(componentID); jj++) {
                        Block& currentBlock = currentMCU[componentID][ii * getHorizontalSamplingFrequency(componentID) + jj];
                        const Block& quantizationTable = JPG::getQuantizationTableByID(componentID);

                        for(uint index = 0; index < 64; index++) {
                             currentBlock[index] = currentBlock[index] / quantizationTable[index];
                        }
                    }
                }             
            }
        }
    }  
}